

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O3

void __thiscall
t_java_generator::generate_java_struct(t_java_generator *this,t_struct *tstruct,bool is_exception)

{
  _func_int **pp_Var1;
  pointer pcVar2;
  long lVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 *puVar5;
  long *plVar6;
  ostream *poVar7;
  long *plVar8;
  t_java_generator *ptVar9;
  ulong uVar10;
  undefined8 uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string f_struct_name;
  size_type __dnew;
  ofstream_with_content_based_conditional_update f_struct;
  ulong *local_260;
  long local_258;
  ulong local_250 [2];
  string local_240;
  long *local_220;
  long local_218;
  long local_210 [2];
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  t_java_generator *local_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  _func_int *local_1c0 [12];
  string local_160 [32];
  undefined1 local_140;
  ios_base local_138 [264];
  
  pcVar2 = (this->package_dir_)._M_dataplus._M_p;
  local_260 = local_250;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260,pcVar2,pcVar2 + (this->package_dir_)._M_string_length);
  ptVar9 = (t_java_generator *)0x378461;
  std::__cxx11::string::append((char *)&local_260);
  iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  make_valid_java_identifier(&local_240,ptVar9,(string *)CONCAT44(extraout_var,iVar4));
  uVar10 = 0xf;
  if (local_260 != local_250) {
    uVar10 = local_250[0];
  }
  if (uVar10 < local_240._M_string_length + local_258) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      uVar11 = local_240.field_2._M_allocated_capacity;
    }
    if (local_240._M_string_length + local_258 <= (ulong)uVar11) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,(ulong)local_260);
      goto LAB_00248430;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_240._M_dataplus._M_p);
LAB_00248430:
  local_1d0._0_8_ = local_1c0;
  pp_Var1 = (_func_int **)(puVar5 + 2);
  if ((_func_int **)*puVar5 == pp_Var1) {
    local_1c0[0] = *pp_Var1;
    local_1c0[1] = (_func_int *)puVar5[3];
  }
  else {
    local_1c0[0] = *pp_Var1;
    local_1d0._0_8_ = (_func_int **)*puVar5;
  }
  local_1d0._8_8_ = puVar5[1];
  *puVar5 = pp_Var1;
  puVar5[1] = 0;
  *(undefined1 *)pp_Var1 = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_1d0);
  local_200 = &local_1f0;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_1f0 = *plVar8;
    lStack_1e8 = plVar6[3];
  }
  else {
    local_1f0 = *plVar8;
    local_200 = (long *)*plVar6;
  }
  local_1f8 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((_func_int **)local_1d0._0_8_ != local_1c0) {
    operator_delete((void *)local_1d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  if (local_260 != local_250) {
    operator_delete(local_260);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  std::__cxx11::string::string((string *)&local_260,(char *)local_200,(allocator *)&local_240);
  std::__cxx11::string::_M_assign(local_160);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  local_140 = 0;
  if (local_260 != local_250) {
    operator_delete(local_260);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_260,this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,(char *)local_260,local_258);
  java_package_abi_cxx11_(&local_240,this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_240._M_dataplus._M_p,local_240._M_string_length);
  local_1d8 = 0x49;
  local_220 = local_210;
  local_1e0 = this;
  plVar6 = (long *)std::__cxx11::string::_M_create((ulong *)&local_220,(ulong)&local_1d8);
  lVar3 = local_1d8;
  local_210[0] = local_1d8;
  local_220 = plVar6;
  memcpy(plVar6,
         "@SuppressWarnings({\"cast\", \"rawtypes\", \"serial\", \"unchecked\", \"unused\"})\n",0x49
        );
  local_218 = lVar3;
  *(undefined1 *)((long)plVar6 + lVar3) = 0;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_220,lVar3);
  ptVar9 = local_1e0;
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  if (local_260 != local_250) {
    operator_delete(local_260);
  }
  poVar7 = (ostream *)local_1d0;
  generate_java_struct_definition(ptVar9,poVar7,tstruct,is_exception,false,false);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,(int)poVar7);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base(local_138);
  if (local_200 != &local_1f0) {
    operator_delete(local_200);
  }
  return;
}

Assistant:

void t_java_generator::generate_java_struct(t_struct* tstruct, bool is_exception) {
  // Make output file
  string f_struct_name = package_dir_ + "/" + make_valid_java_filename(tstruct->get_name())
                         + ".java";
  ofstream_with_content_based_conditional_update f_struct;
  f_struct.open(f_struct_name.c_str());

  f_struct << autogen_comment() << java_package() << java_suppressions();

  generate_java_struct_definition(f_struct, tstruct, is_exception);
  f_struct.close();
}